

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.h
# Opt level: O0

Request<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdParams,_capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdResults>
* __thiscall
capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::Client::
getCallerIdRequest(Request<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdParams,_capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdResults>
                   *__return_storage_ptr__,Client *this,Maybe<capnp::MessageSize> *sizeHint)

{
  _func_int *p_Var1;
  Maybe<capnp::MessageSize> local_38;
  Maybe<capnp::MessageSize> *local_20;
  Maybe<capnp::MessageSize> *sizeHint_local;
  Client *this_local;
  
  p_Var1 = this->_vptr_Client[-3];
  local_20 = sizeHint;
  sizeHint_local = (Maybe<capnp::MessageSize> *)this;
  this_local = (Client *)__return_storage_ptr__;
  kj::Maybe<capnp::MessageSize>::Maybe(&local_38,sizeHint);
  ::capnp::Capability::Client::
  newCall<capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdParams,capnproto_test::capnp::test::TestAuthenticatedBootstrap<capnp::rpc::twoparty::VatId>::GetCallerIdResults>
            (__return_storage_ptr__,(Client *)((long)&this->_vptr_Client + (long)p_Var1),
             0xea72cc77253798cd,0,&local_38);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_38);
  return __return_storage_ptr__;
}

Assistant:

TestAuthenticatedBootstrap<VatId>::Client::getCallerIdRequest(::kj::Maybe< ::capnp::MessageSize> sizeHint) {
  return newCall<typename  ::capnproto_test::capnp::test::TestAuthenticatedBootstrap<VatId>::GetCallerIdParams, typename  ::capnproto_test::capnp::test::TestAuthenticatedBootstrap<VatId>::GetCallerIdResults>(
      0xea72cc77253798cdull, 0, sizeHint);
}